

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_connection.c
# Opt level: O0

apx_error_t
gather_provide_port_connector_changes
          (adt_ary_t *node_instance_array,adt_ary_t *provider_change_array)

{
  apx_dataState_t aVar1;
  adt_error_t error_code;
  int32_t iVar2;
  apx_error_t aVar3;
  apx_nodeInstance_t *self;
  apx_portConnectorChangeTable_t *connector_changes_00;
  apx_portConnectorChangeRef_t *pElem;
  adt_error_t rc;
  apx_portConnectorChangeRef_t *ref;
  apx_portConnectorChangeTable_t *connector_changes;
  apx_nodeInstance_t *node_instance;
  int iStack_24;
  apx_dataState_t provide_port_data_state;
  int32_t num_nodes;
  int32_t i;
  adt_ary_t *provider_change_array_local;
  adt_ary_t *node_instance_array_local;
  
  if ((node_instance_array == (adt_ary_t *)0x0) || (provider_change_array == (adt_ary_t *)0x0)) {
    __assert_fail("(node_instance_array != NULL) && (provider_change_array != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                  ,0x274,
                  "apx_error_t gather_provide_port_connector_changes(adt_ary_t *, adt_ary_t *)");
  }
  iVar2 = adt_ary_length(node_instance_array);
  iStack_24 = 0;
  do {
    if (iVar2 <= iStack_24) {
      return 0;
    }
    self = (apx_nodeInstance_t *)adt_ary_value(node_instance_array,iStack_24);
    if (self == (apx_nodeInstance_t *)0x0) {
      __assert_fail("node_instance != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/server_connection.c"
                    ,0x27a,
                    "apx_error_t gather_provide_port_connector_changes(adt_ary_t *, adt_ary_t *)");
    }
    aVar1 = apx_nodeInstance_get_provide_port_data_state(self);
    if (aVar1 == '\x04') {
      connector_changes_00 = apx_nodeInstance_get_provide_port_connector_changes(self,false);
      if (connector_changes_00 == (apx_portConnectorChangeTable_t *)0x0) {
        apx_nodeInstance_set_provide_port_data_state(self,'\x05');
      }
      else {
        pElem = apx_portConnectorChangeRef_new(self,connector_changes_00);
        if (pElem == (apx_portConnectorChangeRef_t *)0x0) {
          return 2;
        }
        error_code = adt_ary_push(provider_change_array,pElem);
        if (error_code != '\0') {
          aVar3 = convert_from_adt_to_apx_error(error_code);
          return aVar3;
        }
        apx_nodeInstance_clear_provide_port_connector_changes(self,false);
      }
    }
    iStack_24 = iStack_24 + 1;
  } while( true );
}

Assistant:

static apx_error_t gather_provide_port_connector_changes(adt_ary_t* node_instance_array, adt_ary_t* provider_change_array)
{
   int32_t i;
   int32_t num_nodes;
   assert( (node_instance_array != NULL) && (provider_change_array != NULL));
   num_nodes = adt_ary_length(node_instance_array);
   for (i = 0; i < num_nodes; i++)
   {
      apx_dataState_t provide_port_data_state;
      apx_nodeInstance_t* node_instance = (apx_nodeInstance_t*)adt_ary_value(node_instance_array, i);
      assert(node_instance != 0);
      provide_port_data_state = apx_nodeInstance_get_provide_port_data_state(node_instance);
      if (provide_port_data_state == APX_DATA_STATE_CONNECTED)
      {
         apx_portConnectorChangeTable_t* connector_changes = apx_nodeInstance_get_provide_port_connector_changes(node_instance, false);
         if (connector_changes != NULL)
         {
            apx_portConnectorChangeRef_t* ref;
            adt_error_t rc;
            ref = apx_portConnectorChangeRef_new(node_instance, connector_changes);
            if (ref == 0)
            {
               return APX_MEM_ERROR;
            }
            rc = adt_ary_push(provider_change_array, (void*)ref);
            if (rc != ADT_NO_ERROR)
            {
               return convert_from_adt_to_apx_error(rc);
            }
            apx_nodeInstance_clear_provide_port_connector_changes(node_instance, false); //This moves ownership of the memory to the ref variable.
         }
         else
         {
            //This node was not connected to any require ports, no further processing needed
            apx_nodeInstance_set_provide_port_data_state(node_instance, APX_DATA_STATE_DISCONNECTED);
         }
      }
   }
   return APX_NO_ERROR;
}